

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall
boost::shared_ptr<boost::runtime::argument>::
shared_ptr<boost::runtime::typed_argument<boost::unit_test::report_level>>
          (shared_ptr<boost::runtime::argument> *this,
          typed_argument<boost::unit_test::report_level> *p)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  shared_count local_18;
  
  this->px = &p->super_argument;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  local_18.pi_ = in_RAX;
  detail::shared_count::shared_count<boost::runtime::typed_argument<boost::unit_test::report_level>>
            (&local_18,p);
  psVar1 = (this->pn).pi_;
  (this->pn).pi_ = local_18.pi_;
  local_18.pi_ = psVar1;
  detail::shared_count::~shared_count(&local_18);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }